

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry_creation.cpp
# Opt level: O1

Ref<embree::SceneGraph::Node> __thiscall
embree::SceneGraph::createSphereShapedHair
          (SceneGraph *this,Vec3fa *center,float radius,
          Ref<embree::SceneGraph::MaterialNode> *material)

{
  pointer *ppHVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  iterator __position;
  pointer pvVar4;
  size_t sVar5;
  ulong uVar6;
  Vec3fx *pVVar7;
  undefined8 uVar8;
  ulong uVar9;
  Node *pNVar10;
  HairSetNode *this_00;
  Vec3fx *pVVar11;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  float in_XMM0_Db;
  float in_XMM0_Dc;
  float in_XMM0_Dd;
  float fVar15;
  float fVar16;
  float fVar17;
  Ref<embree::SceneGraph::MaterialNode> local_80;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  Hair local_58;
  Node *local_50;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  local_68 = radius;
  fStack_64 = in_XMM0_Db;
  fStack_60 = in_XMM0_Dc;
  fStack_5c = in_XMM0_Dd;
  this_00 = (HairSetNode *)operator_new(0x118);
  local_80 = (Ref<embree::SceneGraph::MaterialNode>)material->ptr;
  if (local_80.ptr != (MaterialNode *)0x0) {
    (*((local_80.ptr)->super_Node).super_RefCount._vptr_RefCount[2])();
  }
  HairSetNode::HairSetNode
            (this_00,RTC_GEOMETRY_TYPE_FLAT_BEZIER_CURVE,&local_80,(BBox1f)0x3f80000000000000,1);
  (*(this_00->super_Node).super_RefCount._vptr_RefCount[2])(this_00);
  if (local_80.ptr != (MaterialNode *)0x0) {
    (*((local_80.ptr)->super_Node).super_RefCount._vptr_RefCount[3])();
  }
  local_58.vertex = 0;
  local_58.id = 0;
  __position._M_current =
       (this_00->hairs).
       super__Vector_base<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_50 = (Node *)this;
  if (__position._M_current ==
      (this_00->hairs).
      super__Vector_base<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
    ::_M_realloc_insert<embree::SceneGraph::HairSetNode::Hair>(&this_00->hairs,__position,&local_58)
    ;
  }
  else {
    (__position._M_current)->vertex = 0;
    (__position._M_current)->id = 0;
    ppHVar1 = &(this_00->hairs).
               super__Vector_base<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppHVar1 = *ppHVar1 + 1;
  }
  pvVar4 = (this_00->positions).
           super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  sVar5 = pvVar4->size_active;
  uVar6 = pvVar4->size_alloced;
  uVar13 = sVar5 + 1;
  uVar14 = uVar6;
  if ((uVar6 < uVar13) && (uVar14 = uVar13, uVar9 = uVar6, uVar6 != 0)) {
    for (; uVar14 = uVar9, uVar9 < uVar13; uVar9 = uVar9 * 2 + (ulong)(uVar9 * 2 == 0)) {
    }
  }
  local_78 = -local_68 + (center->field_0).m128[0];
  fStack_74 = (center->field_0).m128[1] + 0.0;
  fStack_70 = (center->field_0).m128[2] + 0.0;
  fStack_6c = (center->field_0).m128[3] + 0.0;
  if (uVar6 != uVar14) {
    pVVar7 = pvVar4->items;
    pVVar11 = (Vec3fx *)alignedMalloc(uVar14 << 4,0x10);
    pvVar4->items = pVVar11;
    if (pvVar4->size_active != 0) {
      lVar12 = 0;
      uVar13 = 0;
      do {
        puVar2 = (undefined8 *)((long)&pVVar7->field_0 + lVar12);
        uVar8 = puVar2[1];
        puVar3 = (undefined8 *)((long)&pvVar4->items->field_0 + lVar12);
        *puVar3 = *puVar2;
        puVar3[1] = uVar8;
        uVar13 = uVar13 + 1;
        lVar12 = lVar12 + 0x10;
      } while (uVar13 < pvVar4->size_active);
    }
    alignedFree(pVVar7);
    pvVar4->size_active = sVar5;
    pvVar4->size_alloced = uVar14;
  }
  sVar5 = pvVar4->size_active;
  pvVar4->size_active = sVar5 + 1;
  pVVar7 = pvVar4->items + sVar5;
  (pVVar7->field_0).m128[0] = local_78;
  (pVVar7->field_0).m128[1] = fStack_74;
  (pVVar7->field_0).m128[2] = fStack_70;
  (pVVar7->field_0).m128[3] = local_68;
  pvVar4 = (this_00->positions).
           super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  sVar5 = pvVar4->size_active;
  uVar6 = pvVar4->size_alloced;
  uVar13 = sVar5 + 1;
  uVar14 = uVar6;
  if ((uVar6 < uVar13) && (uVar14 = uVar13, uVar9 = uVar6, uVar6 != 0)) {
    for (; uVar14 = uVar9, uVar9 < uVar13; uVar9 = uVar9 * 2 + (ulong)(uVar9 * 2 == 0)) {
    }
  }
  local_78 = (center->field_0).m128[0] + 0.0;
  fStack_74 = (center->field_0).m128[1] + 0.0;
  fStack_70 = (center->field_0).m128[2] + 0.0;
  fStack_6c = (center->field_0).m128[3] + 0.0;
  if (uVar6 != uVar14) {
    pVVar7 = pvVar4->items;
    pVVar11 = (Vec3fx *)alignedMalloc(uVar14 << 4,0x10);
    pvVar4->items = pVVar11;
    if (pvVar4->size_active != 0) {
      lVar12 = 0;
      uVar13 = 0;
      do {
        puVar2 = (undefined8 *)((long)&pVVar7->field_0 + lVar12);
        uVar8 = puVar2[1];
        puVar3 = (undefined8 *)((long)&pvVar4->items->field_0 + lVar12);
        *puVar3 = *puVar2;
        puVar3[1] = uVar8;
        uVar13 = uVar13 + 1;
        lVar12 = lVar12 + 0x10;
      } while (uVar13 < pvVar4->size_active);
    }
    alignedFree(pVVar7);
    pvVar4->size_active = sVar5;
    pvVar4->size_alloced = uVar14;
  }
  sVar5 = pvVar4->size_active;
  pvVar4->size_active = sVar5 + 1;
  pVVar7 = pvVar4->items + sVar5;
  (pVVar7->field_0).m128[0] = local_78;
  (pVVar7->field_0).m128[1] = fStack_74;
  (pVVar7->field_0).m128[2] = fStack_70;
  (pVVar7->field_0).m128[3] = local_68;
  pvVar4 = (this_00->positions).
           super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  sVar5 = pvVar4->size_active;
  uVar6 = pvVar4->size_alloced;
  uVar13 = sVar5 + 1;
  uVar14 = uVar6;
  if ((uVar6 < uVar13) && (uVar14 = uVar13, uVar9 = uVar6, uVar6 != 0)) {
    for (; uVar14 = uVar9, uVar9 < uVar13; uVar9 = uVar9 * 2 + (ulong)(uVar9 * 2 == 0)) {
    }
  }
  fVar15 = (center->field_0).m128[0] + 0.0;
  fVar16 = (center->field_0).m128[1] + 0.0;
  fVar17 = (center->field_0).m128[2] + 0.0;
  local_78 = local_68;
  fStack_74 = local_68;
  fStack_70 = local_68;
  fStack_6c = local_68;
  if (uVar6 != uVar14) {
    pVVar7 = pvVar4->items;
    local_48 = fVar15;
    fStack_44 = fVar16;
    fStack_40 = fVar17;
    fStack_3c = (center->field_0).m128[3] + 0.0;
    pVVar11 = (Vec3fx *)alignedMalloc(uVar14 << 4,0x10);
    pvVar4->items = pVVar11;
    if (pvVar4->size_active != 0) {
      lVar12 = 0;
      uVar13 = 0;
      do {
        puVar2 = (undefined8 *)((long)&pVVar7->field_0 + lVar12);
        uVar8 = puVar2[1];
        puVar3 = (undefined8 *)((long)&pvVar4->items->field_0 + lVar12);
        *puVar3 = *puVar2;
        puVar3[1] = uVar8;
        uVar13 = uVar13 + 1;
        lVar12 = lVar12 + 0x10;
      } while (uVar13 < pvVar4->size_active);
    }
    alignedFree(pVVar7);
    pvVar4->size_active = sVar5;
    pvVar4->size_alloced = uVar14;
    fVar15 = local_48;
    fVar16 = fStack_44;
    fVar17 = fStack_40;
  }
  sVar5 = pvVar4->size_active;
  pvVar4->size_active = sVar5 + 1;
  pVVar7 = pvVar4->items + sVar5;
  (pVVar7->field_0).m128[0] = fVar15;
  (pVVar7->field_0).m128[1] = fVar16;
  (pVVar7->field_0).m128[2] = fVar17;
  (pVVar7->field_0).m128[3] = fStack_6c;
  pvVar4 = (this_00->positions).
           super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  sVar5 = pvVar4->size_active;
  uVar6 = pvVar4->size_alloced;
  uVar13 = sVar5 + 1;
  uVar14 = uVar6;
  if ((uVar6 < uVar13) && (uVar14 = uVar13, uVar9 = uVar6, uVar6 != 0)) {
    for (; uVar14 = uVar9, uVar9 < uVar13; uVar9 = uVar9 * 2 + (ulong)(uVar9 * 2 == 0)) {
    }
  }
  fVar15 = local_68 + (center->field_0).m128[0];
  fVar16 = (center->field_0).m128[1] + 0.0;
  fVar17 = (center->field_0).m128[2] + 0.0;
  if (uVar6 != uVar14) {
    pVVar7 = pvVar4->items;
    local_68 = fVar15;
    fStack_64 = fVar16;
    fStack_60 = fVar17;
    fStack_5c = (center->field_0).m128[3] + 0.0;
    pVVar11 = (Vec3fx *)alignedMalloc(uVar14 << 4,0x10);
    pvVar4->items = pVVar11;
    if (pvVar4->size_active != 0) {
      lVar12 = 0;
      uVar13 = 0;
      do {
        puVar2 = (undefined8 *)((long)&pVVar7->field_0 + lVar12);
        uVar8 = puVar2[1];
        puVar3 = (undefined8 *)((long)&pvVar4->items->field_0 + lVar12);
        *puVar3 = *puVar2;
        puVar3[1] = uVar8;
        uVar13 = uVar13 + 1;
        lVar12 = lVar12 + 0x10;
      } while (uVar13 < pvVar4->size_active);
    }
    alignedFree(pVVar7);
    pvVar4->size_active = sVar5;
    pvVar4->size_alloced = uVar14;
    fVar15 = local_68;
    fVar16 = fStack_64;
    fVar17 = fStack_60;
  }
  pNVar10 = local_50;
  sVar5 = pvVar4->size_active;
  pvVar4->size_active = sVar5 + 1;
  pVVar7 = pvVar4->items + sVar5;
  (pVVar7->field_0).m128[0] = fVar15;
  (pVVar7->field_0).m128[1] = fVar16;
  (pVVar7->field_0).m128[2] = fVar17;
  (pVVar7->field_0).m128[3] = fStack_6c;
  (local_50->super_RefCount)._vptr_RefCount = (_func_int **)this_00;
  (*(this_00->super_Node).super_RefCount._vptr_RefCount[2])(this_00);
  (*(this_00->super_Node).super_RefCount._vptr_RefCount[3])(this_00);
  return (Ref<embree::SceneGraph::Node>)pNVar10;
}

Assistant:

Ref<SceneGraph::Node> SceneGraph::createSphereShapedHair(const Vec3fa& center, const float radius, Ref<MaterialNode> material)
  {
    Ref<SceneGraph::HairSetNode> mesh = new SceneGraph::HairSetNode(RTC_GEOMETRY_TYPE_FLAT_BEZIER_CURVE,material,BBox1f(0,1),1);
    mesh->hairs.push_back(SceneGraph::HairSetNode::Hair(0,0));
    mesh->positions[0].push_back(Vec3ff(center+Vec3fa(-radius,0,0),radius));
    mesh->positions[0].push_back(Vec3ff(center+Vec3fa(0,0,0),radius));
    mesh->positions[0].push_back(Vec3ff(center+Vec3fa(0,0,0),radius));
    mesh->positions[0].push_back(Vec3ff(center+Vec3fa(+radius,0,0),radius));
    return mesh.dynamicCast<SceneGraph::Node>();
  }